

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbs(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  int iVar1;
  undefined4 uVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  _Var11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  __it2;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  __it1;
  undefined1 local_59 [49];
  
  _Var11._M_current =
       (this->val).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (this->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __it2._M_current = _Var11._M_current + 1;
  if (__it2._M_current != pnVar3 && _Var11._M_current != pnVar3) {
    __it1._M_current = _Var11._M_current;
    do {
      bVar10 = __gnu_cxx::__ops::
               _Iter_comp_iter<soplex::VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::maxAbs()const::{lambda(boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>)#1}>
               ::operator()(local_59,__it1,__it2);
      _Var11._M_current = __it2._M_current;
      if (!bVar10) {
        _Var11._M_current = __it1._M_current;
      }
      __it2._M_current = __it2._M_current + 1;
      __it1._M_current = _Var11._M_current;
    } while (__it2._M_current != pnVar3);
  }
  uVar6 = *(undefined8 *)((_Var11._M_current)->m_backend).data._M_elems;
  uVar7 = *(undefined8 *)(((_Var11._M_current)->m_backend).data._M_elems + 2);
  uVar8 = *(undefined8 *)(((_Var11._M_current)->m_backend).data._M_elems + 4);
  uVar9 = *(undefined8 *)(((_Var11._M_current)->m_backend).data._M_elems + 6);
  uVar4 = *(undefined8 *)(((_Var11._M_current)->m_backend).data._M_elems + 8);
  iVar1 = ((_Var11._M_current)->m_backend).exp;
  bVar10 = ((_Var11._M_current)->m_backend).neg;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).exp = 0;
  (__return_storage_ptr__->m_backend).neg = false;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar6;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar7;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar8;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar9;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = uVar4;
  (__return_storage_ptr__->m_backend).exp = iVar1;
  (__return_storage_ptr__->m_backend).neg = bVar10;
  uVar2 = ((_Var11._M_current)->m_backend).fpclass;
  uVar5 = ((_Var11._M_current)->m_backend).prec_elem;
  (__return_storage_ptr__->m_backend).fpclass = uVar2;
  (__return_storage_ptr__->m_backend).prec_elem = uVar5;
  if ((bVar10 == true) && (uVar2 != 0 || (__return_storage_ptr__->m_backend).data._M_elems[0] != 0))
  {
    (__return_storage_ptr__->m_backend).neg = false;
  }
  return __return_storage_ptr__;
}

Assistant:

R maxAbs() const
   {
      assert(dim() > 0);

      // A helper function for the std::max_element. Because we compare the absolute value.
      auto absCmpr = [](R a, R b)
      {
         return (spxAbs(a) < spxAbs(b));
      };

      auto maxReference = std::max_element(val.begin(), val.end(), absCmpr);

      R maxi = spxAbs(*maxReference);

      assert(maxi >= 0.0);

      return maxi;
   }